

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O0

ChannelList *
Imf_3_4::channelsInView(string *viewName,ChannelList *channelList,StringVector *multiView)

{
  undefined1 uVar1;
  __type _Var2;
  const_iterator __s;
  const_iterator __lhs;
  allocator<char> *in_RDI;
  string view;
  ConstIterator i;
  ChannelList *q;
  Channel *in_stack_000001d0;
  char *in_stack_000001d8;
  ChannelList *in_stack_000001e0;
  Channel *in_stack_ffffffffffffff28;
  ConstIterator *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string local_88 [32];
  string local_68 [32];
  const_iterator local_48;
  StringVector *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  
  ChannelList::ChannelList((ChannelList *)0x2133e1);
  __s._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)in_stack_ffffffffffffff28);
  while( true ) {
    __lhs._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_ffffffffffffff28);
    local_48._M_node = __lhs._M_node;
    uVar1 = operator!=(in_stack_ffffffffffffff30,(ConstIterator *)in_stack_ffffffffffffff28);
    if (!(bool)uVar1) break;
    ChannelList::ConstIterator::name((ConstIterator *)0x213458);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,(char *)__s._M_node,in_RDI);
    viewFromChannelName(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs._M_node,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,in_stack_ffffffffffffff48));
    if (_Var2) {
      in_stack_ffffffffffffff30 =
           (ConstIterator *)ChannelList::ConstIterator::name((ConstIterator *)0x2134d9);
      in_stack_ffffffffffffff28 = ChannelList::ConstIterator::channel((ConstIterator *)0x2134ed);
      ChannelList::insert(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    }
    std::__cxx11::string::~string(local_68);
    ChannelList::ConstIterator::operator++(in_stack_ffffffffffffff30);
  }
  return (ChannelList *)in_RDI;
}

Assistant:

ChannelList
channelsInView (
    const string&       viewName,
    const ChannelList&  channelList,
    const StringVector& multiView)
{
    //
    // Return a list of all channels belonging to view viewName.
    //

    ChannelList q;

    for (ChannelList::ConstIterator i = channelList.begin ();
         i != channelList.end ();
         ++i)
    {
        //
        // Get view name for this channel
        //

        string view = viewFromChannelName (i.name (), multiView);

        //
        // Insert channel into q if it's a member of view viewName
        //

        if (view == viewName) q.insert (i.name (), i.channel ());
    }

    return q;
}